

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
rc::detail::(anonymous_namespace)::mapFromConfig_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Configuration *config)

{
  _anonymous_namespace_ _Var1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  char cVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *extraout_RAX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  char (*__y) [2];
  long lVar11;
  char cVar12;
  uint uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string __str_3;
  string __str_2;
  string __str_1;
  string __str;
  string __str_5;
  string __str_4;
  allocator_type local_31a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_319;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  uVar10 = *(ulong *)this;
  cVar12 = '\x01';
  if (9 < uVar10) {
    uVar9 = uVar10;
    cVar6 = '\x04';
    do {
      cVar12 = cVar6;
      if (uVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0016abc0;
      }
      if (uVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0016abc0;
      }
      if (uVar9 < 10000) goto LAB_0016abc0;
      bVar3 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar6 = cVar12 + '\x04';
    } while (bVar3);
    cVar12 = cVar12 + '\x01';
  }
LAB_0016abc0:
  local_2b0._0_8_ = local_2b0 + 0x10;
  local_318 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)local_2b0,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b0._0_8_,local_2b0._8_4_,uVar10);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_230,(char (*) [5])0x1839ed,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  uVar2 = *(uint *)(this + 8);
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar10 = (ulong)uVar4;
    uVar5 = 4;
    do {
      uVar13 = uVar5;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0016ac69;
      }
      if (uVar8 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0016ac69;
      }
      if (uVar8 < 10000) goto LAB_0016ac69;
      uVar10 = uVar10 / 10000;
      uVar5 = uVar13 + 4;
    } while (99999 < uVar8);
    uVar13 = uVar13 + 1;
  }
LAB_0016ac69:
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_2d0,(char)uVar13 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_2d0._M_dataplus._M_p + (uVar2 >> 0x1f),uVar13,uVar4);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1f0,(char (*) [12])"max_success",&local_2d0);
  uVar2 = *(uint *)(this + 0xc);
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar10 = (ulong)uVar4;
    uVar5 = 4;
    do {
      uVar13 = uVar5;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0016ad19;
      }
      if (uVar8 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0016ad19;
      }
      if (uVar8 < 10000) goto LAB_0016ad19;
      uVar10 = uVar10 / 10000;
      uVar5 = uVar13 + 4;
    } while (99999 < uVar8);
    uVar13 = uVar13 + 1;
  }
LAB_0016ad19:
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_2f0,(char)uVar13 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_2f0._M_dataplus._M_p + (uVar2 >> 0x1f),uVar13,uVar4);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1b0,(char (*) [9])"max_size",&local_2f0);
  uVar2 = *(uint *)(this + 0x10);
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar10 = (ulong)uVar4;
    uVar5 = 4;
    do {
      uVar13 = uVar5;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0016adc9;
      }
      if (uVar8 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0016adc9;
      }
      if (uVar8 < 10000) goto LAB_0016adc9;
      uVar10 = uVar10 / 10000;
      uVar5 = uVar13 + 4;
    } while (99999 < uVar8);
    uVar13 = uVar13 + 1;
  }
LAB_0016adc9:
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_310,(char)uVar13 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_310._M_dataplus._M_p + (uVar2 >> 0x1f),uVar13,uVar4);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[18],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_170,(char (*) [18])"max_discard_ratio",&local_310);
  __y = (char (*) [2])0x1865f8;
  if (this[0x14] != (_anonymous_namespace_)0x0) {
    __y = (char (*) [2])0x183602;
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[2],_true>(&local_130,(char (*) [9])"noshrink",__y);
  _Var1 = this[0x18];
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_270,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_270._M_dataplus._M_p,1,(uint)(byte)_Var1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_f0,(char (*) [17])"verbose_progress",&local_270);
  _Var1 = this[0x19];
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_290,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_290._M_dataplus._M_p,1,(uint)(byte)_Var1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[18],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_b0,(char (*) [18])"verbose_shrinking",&local_290);
  reproduceMapToString
            (&local_250,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::detail::Reproduce>_>_>
              *)(this + 0x20));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_70,(char (*) [10])"reproduce",&local_250);
  __l._M_len = 8;
  __l._M_array = &local_230;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(local_318,__l,&local_319,&local_31a);
  lVar11 = -0x200;
  paVar14 = &local_70.second.field_2;
  do {
    if (paVar14 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar14->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar14->_M_local_buf + -0x10));
    }
    if (paVar14->_M_local_buf + -0x20 != *(char **)(paVar14->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar14->_M_local_buf + -0x30));
    }
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(paVar14->_M_local_buf + -0x40);
    lVar11 = lVar11 + 0x40;
  } while (lVar11 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  pmVar7 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_2b0 + 0x10);
  if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)local_2b0._0_8_ != pmVar7) {
    operator_delete((void *)local_2b0._0_8_);
    pmVar7 = extraout_RAX;
  }
  return pmVar7;
}

Assistant:

std::map<std::string, std::string> mapFromConfig(const Configuration &config) {
  return {
      {"seed", std::to_string(config.testParams.seed)},
      {"max_success", std::to_string(config.testParams.maxSuccess)},
      {"max_size", std::to_string(config.testParams.maxSize)},
      {"max_discard_ratio", std::to_string(config.testParams.maxDiscardRatio)},
      {"noshrink", config.testParams.disableShrinking ? "1" : "0"},
      {"verbose_progress", std::to_string(config.verboseProgress)},
      {"verbose_shrinking", std::to_string(config.verboseShrinking)},
      {"reproduce", reproduceMapToString(config.reproduce)}};
}